

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RewindLoopFixedCont::Exec
          (RewindLoopFixedCont *this,Matcher *matcher,Char *input,CharCount *inputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks)

{
  int iVar1;
  uint uVar2;
  Program *pPVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  LoopInfo *pLVar8;
  ulong uVar9;
  
  Matcher::QueryContinue(matcher,qcTicks);
  uVar9 = (ulong)*(uint *)&(this->super_Cont).field_0xc;
  if ((ulong)(((matcher->program).ptr)->rep).insts.instsLen < uVar9 + 0x17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar6) goto LAB_00f05627;
    *puVar7 = 0;
  }
  if ((((matcher->program).ptr)->rep).insts.insts.ptr[uVar9] != 'J') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar6) goto LAB_00f05627;
    *puVar7 = 0;
  }
  pPVar3 = (matcher->program).ptr;
  lVar4 = *(long *)&pPVar3->rep;
  iVar1 = *(int *)(lVar4 + 1 + uVar9);
  if (((long)iVar1 < 0) || (pPVar3->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar6) goto LAB_00f05627;
    *puVar7 = 0;
  }
  pLVar8 = (matcher->loopInfos).ptr + iVar1;
  if (this->tryingBody == true) {
    this->tryingBody = false;
    if (pLVar8->number < *(uint *)(lVar4 + 5 + uVar9)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x1245,"(loopInfo->number >= begin->repeats.lower)",
                         "loopInfo->number >= begin->repeats.lower");
      if (!bVar6) goto LAB_00f05627;
      *puVar7 = 0;
    }
  }
  else {
    if (pLVar8->number <= *(uint *)(lVar4 + 5 + uVar9)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x124a,"(loopInfo->number > begin->repeats.lower)",
                         "loopInfo->number > begin->repeats.lower");
      if (!bVar6) goto LAB_00f05627;
      *puVar7 = 0;
    }
    pLVar8->number = pLVar8->number - 1;
  }
  *inputOffset = *(int *)(lVar4 + 0x13 + uVar9) * pLVar8->number + pLVar8->startInputOffset;
  if (*(uint *)(lVar4 + 5 + uVar9) < pLVar8->number) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopFixedCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  uVar2 = *(uint *)(lVar4 + 0xf + uVar9);
  if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar6) {
LAB_00f05627:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
  }
  *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar2;
  return true;
}

Assistant:

inline bool RewindLoopFixedCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        BeginLoopFixedInst* begin = matcher.L2I(BeginLoopFixed, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        if (tryingBody)
        {
            tryingBody = false;
            // loopInfo->number is the number of iterations completed before trying body
            Assert(loopInfo->number >= begin->repeats.lower);
        }
        else
        {
            // loopInfo->number is the number of iterations completed before trying follow
            Assert(loopInfo->number > begin->repeats.lower);
            // Try follow with one fewer iteration
            loopInfo->number--;
        }

        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number * begin->length;

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopFixedCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return true; // STOP BACKTRACKING
    }